

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O0

vec4 ImageCodec::decodeFLOAT_UINTPacked<unsigned_int>(ImageCodec *codec,void *ptr)

{
  uint uVar1;
  size_type sVar2;
  const_reference pvVar3;
  float *pfVar4;
  long in_RSI;
  long in_RDI;
  float fVar5;
  uint32_t rawValue;
  float upper;
  value_type *info;
  size_t i;
  uint *data;
  vec4 result;
  ulong local_30;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 local_10;
  
  glm::vec<4,_float,_(glm::precision)0>::vec
            ((vec<4,_float,_(glm::precision)0> *)&local_10.field_0,0.0,0.0,0.0,1.0);
  local_30 = 0;
  while( true ) {
    sVar2 = std::vector<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_>::size
                      ((vector<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_> *)
                       (in_RDI + 0x28));
    if (sVar2 <= local_30) break;
    pvVar3 = std::vector<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_>::
             operator[]((vector<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_> *)
                        (in_RDI + 0x28),local_30);
    fVar5 = (float)((1 << ((byte)pvVar3->bitLength & 0x1f)) - 1);
    uVar1 = *(uint *)(in_RSI + (ulong)pvVar3->elementIndex * 4) >> ((byte)pvVar3->bitOffset & 0x1f)
            & (1 << ((byte)pvVar3->bitLength & 0x1f)) - 1U;
    pfVar4 = glm::vec<4,_float,_(glm::precision)0>::operator[]
                       ((vec<4,_float,_(glm::precision)0> *)CONCAT44(fVar5,uVar1),
                        (length_type)(local_30 >> 0x20));
    *pfVar4 = (float)uVar1 / fVar5;
    local_30 = local_30 + 1;
  }
  return (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)
         (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)local_10.field_0;
}

Assistant:

static glm::vec4 decodeFLOAT_UINTPacked(const ImageCodec* codec, const void* ptr) {
        static_assert(std::is_unsigned_v<TYPE>);
        auto data = reinterpret_cast<const TYPE*>(ptr);
        glm::vec4 result(0.f, 0.f, 0.f, 1.f);
        for (std::size_t i = 0; i < codec->packedSampleInfo.size(); ++i) {
            const auto& info = codec->packedSampleInfo[i];
            const auto upper = static_cast<float>((1u << info.bitLength) - 1u);
            uint32_t rawValue = (data[info.elementIndex] >> info.bitOffset) & ((1u << info.bitLength) - 1u);
            result[static_cast<glm::length_t>(i)] = static_cast<float>(rawValue) / upper;
        }
        return result;
    }